

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rshapes.c
# Opt level: O1

void DrawLineBezier(Vector2 startPos,Vector2 endPos,float thick,Color color)

{
  int iVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float local_24c;
  float local_248;
  float local_244;
  float local_238;
  float local_218;
  float fStack_214;
  float afStack_1c4 [3];
  Vector2 local_1b8;
  float local_1b0;
  float local_1ac;
  float afStack_1a8 [98];
  
  fVar5 = startPos.y;
  memset(&local_1b8,0,400);
  local_238 = startPos.x;
  local_218 = endPos.x;
  fStack_214 = endPos.y;
  local_244 = local_1b8.x;
  local_248 = local_1b8.y;
  fVar6 = (fStack_214 - fVar5) * 0.5;
  local_24c = local_1b0;
  lVar2 = 0x1c;
  iVar1 = 1;
  fVar7 = local_238;
  fVar9 = fVar5;
  do {
    fVar3 = (float)iVar1 / 12.0;
    if (1.0 <= fVar3) {
      fVar3 = fVar3 + -2.0;
      fVar8 = 0.0;
      fVar3 = (fVar3 * fVar3 * fVar3 + 2.0) * fVar6;
    }
    else {
      fVar3 = fVar6 * fVar3 * fVar3 * fVar3;
      fVar8 = fStack_214 - fVar5;
    }
    fVar3 = fVar3 + fVar5;
    fVar10 = (local_218 - local_238) / 24.0 + fVar7;
    fVar11 = fVar3 - fVar9;
    fVar12 = fVar10 - fVar7;
    fVar4 = fVar12 * fVar12 + fVar11 * fVar11;
    if (fVar4 < 0.0) {
      afStack_1c4[0] = fVar8;
      afStack_1c4[1] = fVar8;
      afStack_1c4[2] = fVar8;
      fVar4 = sqrtf(fVar4);
    }
    else {
      fVar4 = SQRT(fVar4);
    }
    fVar4 = (thick * 0.5) / fVar4;
    fVar11 = fVar11 * fVar4;
    fVar12 = fVar12 * fVar4;
    if (lVar2 == 0x1c) {
      local_244 = fVar11 + fVar7;
      local_24c = fVar7 - fVar11;
      local_1ac = fVar12 + fVar9;
      local_248 = fVar9 - fVar12;
    }
    *(float *)((long)afStack_1c4 + lVar2 + 8) = fVar10 - fVar11;
    *(float *)((long)&local_1b8.x + lVar2) = fVar12 + fVar3;
    *(float *)((long)afStack_1c4 + lVar2) = fVar11 + fVar10;
    *(float *)((long)afStack_1c4 + lVar2 + 4) = fVar3 - fVar12;
    lVar2 = lVar2 + 0x10;
    iVar1 = iVar1 + 1;
    fVar7 = fVar10;
    fVar9 = fVar3;
  } while (lVar2 != 0x19c);
  local_1b8.y = local_248;
  local_1b0 = local_24c;
  local_1b8.x = local_244;
  DrawTriangleStrip(&local_1b8,0x32,color);
  return;
}

Assistant:

void DrawLineBezier(Vector2 startPos, Vector2 endPos, float thick, Color color)
{
    Vector2 previous = startPos;
    Vector2 current = { 0 };

    Vector2 points[2*SPLINE_SEGMENT_DIVISIONS + 2] = { 0 };

    for (int i = 1; i <= SPLINE_SEGMENT_DIVISIONS; i++)
    {
        // Cubic easing in-out
        // NOTE: Easing is calculated only for y position value
        current.y = EaseCubicInOut((float)i, startPos.y, endPos.y - startPos.y, (float)SPLINE_SEGMENT_DIVISIONS);
        current.x = previous.x + (endPos.x - startPos.x)/(float)SPLINE_SEGMENT_DIVISIONS;

        float dy = current.y - previous.y;
        float dx = current.x - previous.x;
        float size = 0.5f*thick/sqrtf(dx*dx+dy*dy);

        if (i == 1)
        {
            points[0].x = previous.x + dy*size;
            points[0].y = previous.y - dx*size;
            points[1].x = previous.x - dy*size;
            points[1].y = previous.y + dx*size;
        }

        points[2*i + 1].x = current.x - dy*size;
        points[2*i + 1].y = current.y + dx*size;
        points[2*i].x = current.x + dy*size;
        points[2*i].y = current.y - dx*size;

        previous = current;
    }

    DrawTriangleStrip(points, 2*SPLINE_SEGMENT_DIVISIONS + 2, color);
}